

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O3

void __thiscall icu_63::RangeDescriptor::RangeDescriptor(RangeDescriptor *this,UErrorCode *status)

{
  UVector *this_00;
  UErrorCode UVar1;
  
  this->fStartChar = 0;
  this->fEndChar = 0;
  this->fNum = 0;
  this->fNext = (RangeDescriptor *)0x0;
  UVar1 = *status;
  this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)status);
  if (this_00 != (UVector *)0x0) {
    UVector::UVector(this_00,status);
  }
  this->fIncludesSets = this_00;
  if ((U_ZERO_ERROR < UVar1) ||
     (UVar1 = U_MEMORY_ALLOCATION_ERROR,
     this_00 == (UVector *)0x0 && *status < U_ILLEGAL_ARGUMENT_ERROR)) {
    *status = UVar1;
  }
  return;
}

Assistant:

RangeDescriptor::RangeDescriptor(UErrorCode &status) {
    this->fStartChar    = 0;
    this->fEndChar      = 0;
    this->fNum          = 0;
    this->fNext         = NULL;
    UErrorCode oldstatus = status;
    this->fIncludesSets = new UVector(status);
    if (U_FAILURE(oldstatus)) {
        status = oldstatus;
    }
    if (U_FAILURE(status)) {
        return;
    }
    /* test for NULL */
    if(this->fIncludesSets == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

}